

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Generators_Stratified1D_Test::TestBody(Generators_Stratified1D_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  char *message;
  char *in_R9;
  int iVar6;
  uint64_t oldstate;
  undefined1 *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 in_XMM4_Da;
  undefined1 in_register_00001304 [12];
  int count;
  int n;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_78;
  int local_70;
  int local_6c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_58;
  AssertHelper local_38;
  
  local_70 = 0;
  local_6c = 0x80;
  puVar7 = &DAT_5851f42d4c957f2e;
  iVar6 = 0;
  do {
    uVar5 = (uint)((ulong)puVar7 >> 0x2d) ^ (uint)((ulong)puVar7 >> 0x1b);
    bVar3 = (byte)((ulong)puVar7 >> 0x3b);
    auVar8._4_12_ = in_register_00001304;
    auVar8._0_4_ = in_XMM4_Da;
    auVar8 = vcvtusi2ss_avx512f(auVar8,uVar5 >> bVar3 | uVar5 << 0x20 - bVar3);
    auVar8 = vminss_avx(ZEXT416((uint)(auVar8._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    auVar9._0_4_ = (float)local_70 / (float)local_6c;
    auVar9._4_12_ = in_register_00001304;
    auVar10._0_4_ = (float)(local_70 + 1) / (float)local_6c;
    auVar10._4_12_ = in_register_00001304;
    auVar8 = ZEXT416((uint)((auVar8._0_4_ + (float)iVar6) * 0.0078125));
    uVar1 = vcmpps_avx512vl(auVar9,auVar8,2);
    uVar2 = vcmpps_avx512vl(auVar8,auVar10,1);
    bVar3 = (byte)uVar1 & (byte)uVar2;
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_68.ptr_._1_7_,bVar3) & 0xffffffffffffff01);
    local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bVar3 & 1) == 0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,(internal *)&local_68,
                 (AssertionResult *)
                 "u >= Float(count) / Float(n) && u < Float(count + 1) / Float(n)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x46d,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                         (char)local_58._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p) !=
          &local_58.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p),
                        local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_78.data_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_78.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
        local_78.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    puVar7 = (undefined1 *)((long)puVar7 * 0x5851f42d4c957f2d + 1);
    local_70 = local_70 + 1;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x80);
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_58,"n","count",&local_6c,&local_70);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x470,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Generators, Stratified1D) {
    int count = 0, n = 128;  // power of 2
    for (Float u : Stratified1D(n)) {
        EXPECT_TRUE(u >= Float(count) / Float(n) && u < Float(count + 1) / Float(n));
        ++count;
    }
    EXPECT_EQ(n, count);
}